

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

OPJ_BOOL opj_read_header(opj_stream_t *p_stream,opj_codec_t *p_codec,opj_image_t **p_image)

{
  OPJ_BOOL OVar1;
  
  if (p_stream != (opj_stream_t *)0x0 && p_codec != (opj_codec_t *)0x0) {
    if (*(int *)(p_codec + 0x12) != 0) {
      OVar1 = (*(code *)*p_codec)(p_stream,p_codec[0xb],p_image,p_codec + 0xc);
      return OVar1;
    }
    opj_event_msg((opj_event_mgr_t *)(p_codec + 0xc),1,
                  "Codec provided to the opj_read_header function is not a decompressor handler.\n")
    ;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_read_header(opj_stream_t *p_stream,
                                      opj_codec_t *p_codec,
                                      opj_image_t **p_image)
{
    if (p_codec && p_stream) {
        opj_codec_private_t* l_codec = (opj_codec_private_t*) p_codec;
        opj_stream_private_t* l_stream = (opj_stream_private_t*) p_stream;

        if (! l_codec->is_decompressor) {
            opj_event_msg(&(l_codec->m_event_mgr), EVT_ERROR,
                          "Codec provided to the opj_read_header function is not a decompressor handler.\n");
            return OPJ_FALSE;
        }

        return l_codec->m_codec_data.m_decompression.opj_read_header(l_stream,
                l_codec->m_codec,
                p_image,
                &(l_codec->m_event_mgr));
    }

    return OPJ_FALSE;
}